

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShader_gl_in_ArrayContentsTest::initTest
          (GeometryShader_gl_in_ArrayContentsTest *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar7;
  char *local_68;
  char *geometry_shader_sized_arrays_code [2];
  char *geometry_shader_unsized_arrays_code [3];
  Functions *gl;
  char *pcStack_28;
  GLuint n_captured_varyings_size;
  GLchar *captured_varyings [2];
  GeometryShader_gl_in_ArrayContentsTest *this_local;
  long lVar6;
  
  pcStack_28 = "gs_fs_a";
  captured_varyings[0] = "gs_fs_b";
  captured_varyings[1] = (GLchar *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_program_object_sized_arrays_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_program_object_unsized_arrays_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_unsized_arrays_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_sized_arrays_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Failed to create program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x15a);
  (**(code **)(lVar6 + 0x14c8))
            (this->m_program_object_sized_arrays_id,2,&stack0xffffffffffffffd8,0x8c8c);
  (**(code **)(lVar6 + 0x14c8))
            (this->m_program_object_unsized_arrays_id,2,&stack0xffffffffffffffd8,0x8c8c);
  geometry_shader_sized_arrays_code[1] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(triangles)                      in;\nlayout(triangle_strip, max_vertices=3) out;\n\n"
  ;
  local_68 = 
  "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(triangles)                      in;\nlayout(triangle_strip, max_vertices=3) out;\n\n"
  ;
  geometry_shader_sized_arrays_code[0] =
       "#ifdef USE_UNSIZED_ARRAYS\n         in  vec2 vs_gs_a[];\n    flat in ivec4 vs_gs_b[];\n#else\n         in  vec2 vs_gs_a[3];\n    flat in ivec4 vs_gs_b[3];\n#endif\n\n     out  vec2 gs_fs_a;\nflat out ivec4 gs_fs_b;\n\nvoid main()\n{\n    gl_Position = vec4(-1, -1, 0, 1);\n    gs_fs_a     = vs_gs_a[0];\n    gs_fs_b     = vs_gs_b[0];\n    EmitVertex();\n    \n    gl_Position = vec4(-1, 1, 0, 1);\n    gs_fs_a     = vs_gs_a[1];\n    gs_fs_b     = vs_gs_b[1];\n    EmitVertex();\n    \n    gl_Position = vec4(1, 1, 0, 1);\n    gs_fs_a     = vs_gs_a[2];\n    gs_fs_b     = vs_gs_b[2];\n    EmitVertex();\n    \n    EndPrimitive();\n}\n"
  ;
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_object_unsized_arrays_id,
                     this->m_fragment_shader_id,1,&m_fragment_shader_code,
                     this->m_geometry_shader_unsized_arrays_id,3,
                     geometry_shader_sized_arrays_code + 1,this->m_vertex_shader_id,1,
                     &m_vertex_shader_code,(bool *)0x0);
  if (!bVar1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,
               "Could not create a program from valid vertex/geometry (unsized arrays version)/fragment shaders"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x16d);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_object_sized_arrays_id,
                     this->m_fragment_shader_id,1,&m_fragment_shader_code,
                     this->m_geometry_shader_sized_arrays_id,2,&local_68,this->m_vertex_shader_id,1,
                     &m_vertex_shader_code,(bool *)0x0);
  if (!bVar1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,
               "Could not create a program from valid vertex/geometry (sized arrays version)/fragment shaders"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x176);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_buffer_object_id);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_buffer_object_id);
  (**(code **)(lVar6 + 0x150))(0x8892,0x48,0,0x88e4);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Could not create buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x17e);
  (**(code **)(lVar6 + 0x708))(1,&this->m_vertex_array_object_id);
  (**(code **)(lVar6 + 0xd8))(this->m_vertex_array_object_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Could not create vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x184);
  return;
}

Assistant:

void GeometryShader_gl_in_ArrayContentsTest::initTest()
{
	/* Varing names */
	const glw::GLchar* const captured_varyings[] = {
		"gs_fs_a", "gs_fs_b",
	};

	/* Number of varings */
	const glw::GLuint n_captured_varyings_size = sizeof(captured_varyings) / sizeof(captured_varyings[0]);

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program and shaders */
	m_program_object_sized_arrays_id   = gl.createProgram();
	m_program_object_unsized_arrays_id = gl.createProgram();

	m_fragment_shader_id				= gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_unsized_arrays_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_geometry_shader_sized_arrays_id   = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id					= gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program");

	/* Set up transform feedback */
	gl.transformFeedbackVaryings(m_program_object_sized_arrays_id, n_captured_varyings_size, captured_varyings,
								 GL_INTERLEAVED_ATTRIBS);
	gl.transformFeedbackVaryings(m_program_object_unsized_arrays_id, n_captured_varyings_size, captured_varyings,
								 GL_INTERLEAVED_ATTRIBS);

	/* Build programs */
	const char* geometry_shader_unsized_arrays_code[] = { m_geometry_shader_preamble_code,
														  "#define USE_UNSIZED_ARRAYS\n", m_geometry_shader_code };
	const char* geometry_shader_sized_arrays_code[] = { m_geometry_shader_preamble_code, m_geometry_shader_code };

	if (false ==
		buildProgram(m_program_object_unsized_arrays_id, m_fragment_shader_id, 1 /* number of fragment shader parts */,
					 &m_fragment_shader_code, m_geometry_shader_unsized_arrays_id,
					 DE_LENGTH_OF_ARRAY(geometry_shader_unsized_arrays_code), geometry_shader_unsized_arrays_code,
					 m_vertex_shader_id, 1 /* number of vertex shader parts */, &m_vertex_shader_code))
	{
		TCU_FAIL("Could not create a program from valid vertex/geometry (unsized arrays version)/fragment shaders");
	}

	if (false == buildProgram(m_program_object_sized_arrays_id, m_fragment_shader_id,
							  1 /* number of fragment shader parts */, &m_fragment_shader_code,
							  m_geometry_shader_sized_arrays_id, DE_LENGTH_OF_ARRAY(geometry_shader_sized_arrays_code),
							  geometry_shader_sized_arrays_code, m_vertex_shader_id,
							  1 /* number of vertex shader parts */, &m_vertex_shader_code))
	{
		TCU_FAIL("Could not create a program from valid vertex/geometry (sized arrays version)/fragment shaders");
	}

	/* Generate, bind and allocate buffer */
	gl.genBuffers(1, &m_buffer_object_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer_object_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_buffer_size, 0 /* no start data */, GL_STATIC_DRAW);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create buffer object");

	/* Generate and bind VAO */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	gl.bindVertexArray(m_vertex_array_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");
}